

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_*(unsigned_long)>::UntypedPerformAction
          (FunctionMockerBase<void_*(unsigned_long)> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<void_*> *pAVar1;
  Action<void_*(unsigned_long)> action;
  linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> local_20;
  
  linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::linked_ptr
            (&local_20,
             (linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)untyped_action);
  pAVar1 = ActionResultHolder<void*>::PerformAction<void*(unsigned_long)>
                     ((Action<void_*(unsigned_long)> *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }